

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

_Bool AArch64_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  uint8_t *puVar2;
  DecodeStatus DVar3;
  uint8_t *orig_p;
  long lVar4;
  byte bVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint64_t Address;
  uint uVar10;
  ulong uVar11;
  uint8_t *orig_p_2;
  uint8_t *puVar12;
  ulong uVar13;
  byte *pbVar14;
  uint8_t *orig_p_1;
  DecodeStatus local_3c;
  
  uVar6 = 0;
  DVar3 = MCDisassembler_Fail;
  if (3 < code_len) {
    __s = instr->flat_insn->detail;
    if (__s != (cs_detail *)0x0) {
      memset(__s,0,0x5f8);
      lVar4 = 0x38;
      do {
        puVar2 = instr->flat_insn->detail->regs_read + lVar4;
        puVar2[0] = 0xff;
        puVar2[1] = 0xff;
        puVar2[2] = 0xff;
        puVar2[3] = 0xff;
        lVar4 = lVar4 + 0x30;
      } while (lVar4 != 0x1b8);
    }
    if (*(char *)(ud + 0x28) == '\x01') {
      uVar8 = *(uint *)code;
      uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    }
    else {
      uVar8 = *(uint *)code;
    }
    uVar9 = 0;
    local_3c = MCDisassembler_Success;
    Address = 0xffffffff;
    puVar2 = DecoderTable32;
LAB_0016399e:
    puVar12 = puVar2;
    switch(*puVar12) {
    case '\x01':
      uVar9 = ~(-1 << (puVar12[2] & 0x1f)) << (puVar12[1] & 0x1f);
      if (puVar12[2] == 0x20) {
        uVar9 = 0xffffffff;
      }
      uVar9 = (uVar9 & uVar8) >> (puVar12[1] & 0x1f);
      puVar2 = puVar12 + 3;
      goto LAB_0016399e;
    case '\x02':
      uVar11 = 0;
      address = 0;
      bVar5 = 0;
      do {
        lVar4 = uVar11 + 1;
        uVar7 = (int)address + ((puVar12[lVar4] & 0x7f) << (bVar5 & 0x1f));
        address = (uint64_t)uVar7;
        bVar5 = bVar5 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar12[lVar4] < '\0');
      puVar2 = puVar12 + (uVar11 & 0xffffffff) + 3;
      if (uVar9 != uVar7) {
        puVar2 = puVar12 + (uVar11 & 0xffffffff) + 3 +
                 *(ushort *)(puVar12 + (uVar11 & 0xffffffff) + 1);
      }
      goto LAB_0016399e;
    case '\x03':
      uVar7 = ~(-1 << (puVar12[2] & 0x1f)) << (puVar12[1] & 0x1f);
      uVar11 = 0;
      address = 0;
      bVar5 = 0;
      do {
        lVar4 = uVar11 + 3;
        uVar10 = (int)address + ((puVar12[lVar4] & 0x7f) << (bVar5 & 0x1f));
        address = (uint64_t)uVar10;
        bVar5 = bVar5 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar12[lVar4] < '\0');
      if (puVar12[2] == 0x20) {
        uVar7 = 0xffffffff;
      }
      puVar2 = puVar12 + (uVar11 & 0xffffffff) + 5;
      if ((uVar7 & uVar8) >> (puVar12[1] & 0x1f) != uVar10) {
        puVar2 = puVar12 + (uVar11 & 0xffffffff) + 5 +
                 *(ushort *)(puVar12 + (uVar11 & 0xffffffff) + 3);
      }
      goto LAB_0016399e;
    case '\x04':
      uVar11 = 0;
      do {
        lVar4 = uVar11 + 1;
        uVar11 = uVar11 + 1;
      } while ((char)puVar12[lVar4] < '\0');
      puVar2 = puVar12 + (uVar11 & 0xffffffff) + 3;
      goto LAB_0016399e;
    case '\x05':
      uVar11 = 0;
      uVar9 = 0;
      bVar5 = 0;
      do {
        lVar4 = uVar11 + 1;
        uVar9 = uVar9 + ((puVar12[lVar4] & 0x7f) << (bVar5 & 0x1f));
        bVar5 = bVar5 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar12[lVar4] < '\0');
      pbVar14 = puVar12 + (uVar11 & 0xffffffff) + 1;
      uVar7 = 0;
      bVar5 = 0;
      do {
        bVar1 = *pbVar14;
        uVar7 = uVar7 + ((bVar1 & 0x7f) << (bVar5 & 0x1f));
        bVar5 = bVar5 + 7;
        pbVar14 = pbVar14 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(instr,uVar9);
      DVar3 = decodeToMCInst(local_3c,uVar7,uVar8,instr,Address,(void *)address);
      if (DVar3 == MCDisassembler_Fail) {
switchD_001639b4_default:
        MCInst_clear(instr);
        uVar6 = 0;
        DVar3 = MCDisassembler_Fail;
      }
      else {
        uVar6 = 4;
      }
      break;
    case '\x06':
      uVar11 = 0;
      uVar7 = 0;
      bVar5 = 0;
      do {
        lVar4 = uVar11 + 1;
        uVar7 = uVar7 + ((puVar12[lVar4] & 0x7f) << (bVar5 & 0x1f));
        bVar5 = bVar5 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar12[lVar4] < '\0');
      uVar13 = 0;
      uVar10 = 0;
      bVar5 = 0;
      do {
        lVar4 = uVar13 + (uVar11 & 0xffffffff) + 1;
        uVar10 = uVar10 + ((puVar12[lVar4] & 0x7f) << (bVar5 & 0x1f));
        bVar5 = bVar5 + 7;
        uVar13 = uVar13 + 1;
      } while ((char)puVar12[lVar4] < '\0');
      uVar7 = uVar10 & ~uVar8 | uVar7 & uVar8;
      address = (uint64_t)uVar7;
      puVar2 = puVar12 + (uVar13 & 0xffffffff) + (uVar11 & 0xffffffff) + 1;
      if (uVar7 != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      goto LAB_0016399e;
    default:
      goto switchD_001639b4_default;
    }
  }
  *size = uVar6;
  return DVar3 == MCDisassembler_Success;
}

Assistant:

bool AArch64_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *instr, uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _getInstruction((cs_struct *)ud, instr,
			code, code_len,
			size,
			address, (MCRegisterInfo *)info);

	return status == MCDisassembler_Success;
}